

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QControlledGate2.hpp
# Opt level: O0

SquareMatrix<std::complex<double>_> __thiscall
qclab::qgates::QControlledGate2<std::complex<double>_>::matrix
          (QControlledGate2<std::complex<double>_> *this)

{
  complex<double> m10;
  complex<double> m10_00;
  complex<double> m11;
  complex<double> m11_00;
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined8 in_RCX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  data_type extraout_RDX_01;
  QControlledGate2<std::complex<double>_> *in_RSI;
  undefined8 uVar3;
  undefined8 in_R8;
  SquareMatrix<std::complex<double>_> SVar4;
  complex<double> m00;
  complex<double> m00_00;
  complex<double> m01;
  complex<double> m01_00;
  undefined8 in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe64;
  undefined4 in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe6c;
  undefined8 in_stack_fffffffffffffe70;
  SquareMatrix<std::complex<double>_> local_170;
  SquareMatrix<std::complex<double>_> local_160;
  SquareMatrix<std::complex<double>_> local_150;
  SquareMatrix<std::complex<double>_> local_140;
  SquareMatrix<std::complex<double>_> local_130;
  SquareMatrix<std::complex<double>_> local_120;
  undefined4 local_10c;
  SquareMatrix<std::complex<double>_> local_108;
  SquareMatrix<std::complex<double>_> local_f8;
  undefined1 local_e8 [8];
  matrix_type CG;
  complex<double> local_c8;
  complex<double> local_b8;
  complex<double> local_a8;
  undefined1 local_98 [8];
  matrix_type E1;
  complex<double> local_78;
  complex<double> local_68 [2];
  complex<double> local_48;
  undefined1 local_38 [8];
  matrix_type E0;
  matrix_type I2;
  QControlledGate2<std::complex<double>_> *this_local;
  
  uVar3 = 2;
  dense::eye<std::complex<double>>((int64_t)&E0.data_);
  std::complex<double>::complex(&local_48,1.0,0.0);
  std::complex<double>::complex(local_68,0.0,0.0);
  std::complex<double>::complex(&local_78,0.0,0.0);
  std::complex<double>::complex((complex<double> *)&E1.data_,0.0,0.0);
  m10._M_value._8_4_ = in_stack_fffffffffffffe60;
  m10._M_value._0_8_ = in_stack_fffffffffffffe58;
  m10._M_value._12_4_ = in_stack_fffffffffffffe64;
  m11._M_value._4_4_ = in_stack_fffffffffffffe6c;
  m11._M_value._0_4_ = in_stack_fffffffffffffe68;
  m11._M_value._8_8_ = in_stack_fffffffffffffe70;
  m00._M_value._8_8_ = extraout_RDX;
  m00._M_value._0_8_ = uVar3;
  m01._M_value._8_8_ = in_R8;
  m01._M_value._0_8_ = in_RCX;
  dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_38,m00,m01,m10,m11);
  std::complex<double>::complex(&local_a8,0.0,0.0);
  std::complex<double>::complex(&local_b8,0.0,0.0);
  std::complex<double>::complex(&local_c8,0.0,0.0);
  std::complex<double>::complex((complex<double> *)&CG.data_,1.0,0.0);
  m10_00._M_value._8_4_ = in_stack_fffffffffffffe60;
  m10_00._M_value._0_8_ = in_stack_fffffffffffffe58;
  m10_00._M_value._12_4_ = in_stack_fffffffffffffe64;
  m11_00._M_value._4_4_ = in_stack_fffffffffffffe6c;
  m11_00._M_value._0_4_ = in_stack_fffffffffffffe68;
  m11_00._M_value._8_8_ = in_stack_fffffffffffffe70;
  m00_00._M_value._8_8_ = extraout_RDX_00;
  m00_00._M_value._0_8_ = uVar3;
  m01_00._M_value._8_8_ = in_R8;
  m01_00._M_value._0_8_ = in_RCX;
  dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_98,m00_00,m01_00,m10_00,m11_00);
  iVar1 = (*(in_RSI->super_QGate2<std::complex<double>_>).super_QObject<std::complex<double>_>.
            _vptr_QObject[0x10])();
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x38))(local_e8);
  if (in_RSI->controlState_ == 0) {
    iVar1 = control(in_RSI);
    iVar2 = (*(in_RSI->super_QGate2<std::complex<double>_>).super_QObject<std::complex<double>_>.
              _vptr_QObject[0xf])();
    if (iVar1 < iVar2) {
      dense::kron<std::complex<double>>
                ((dense *)&local_f8,(SquareMatrix<std::complex<double>_> *)local_38,
                 (SquareMatrix<std::complex<double>_> *)local_e8);
      dense::kron<std::complex<double>>
                ((dense *)&local_108,(SquareMatrix<std::complex<double>_> *)local_98,
                 (SquareMatrix<std::complex<double>_> *)&E0.data_);
      dense::operator+((dense *)this,&local_f8,&local_108);
      dense::SquareMatrix<std::complex<double>_>::~SquareMatrix(&local_108);
      dense::SquareMatrix<std::complex<double>_>::~SquareMatrix(&local_f8);
    }
    else {
      dense::kron<std::complex<double>>
                ((dense *)&local_120,(SquareMatrix<std::complex<double>_> *)local_e8,
                 (SquareMatrix<std::complex<double>_> *)local_38);
      dense::kron<std::complex<double>>
                ((dense *)&local_130,(SquareMatrix<std::complex<double>_> *)&E0.data_,
                 (SquareMatrix<std::complex<double>_> *)local_98);
      dense::operator+((dense *)this,&local_120,&local_130);
      dense::SquareMatrix<std::complex<double>_>::~SquareMatrix(&local_130);
      dense::SquareMatrix<std::complex<double>_>::~SquareMatrix(&local_120);
    }
  }
  else {
    iVar1 = control(in_RSI);
    iVar2 = (*(in_RSI->super_QGate2<std::complex<double>_>).super_QObject<std::complex<double>_>.
              _vptr_QObject[0xf])();
    if (iVar1 < iVar2) {
      dense::kron<std::complex<double>>
                ((dense *)&local_140,(SquareMatrix<std::complex<double>_> *)local_38,
                 (SquareMatrix<std::complex<double>_> *)&E0.data_);
      dense::kron<std::complex<double>>
                ((dense *)&local_150,(SquareMatrix<std::complex<double>_> *)local_98,
                 (SquareMatrix<std::complex<double>_> *)local_e8);
      dense::operator+((dense *)this,&local_140,&local_150);
      dense::SquareMatrix<std::complex<double>_>::~SquareMatrix(&local_150);
      dense::SquareMatrix<std::complex<double>_>::~SquareMatrix(&local_140);
    }
    else {
      dense::kron<std::complex<double>>
                ((dense *)&local_160,(SquareMatrix<std::complex<double>_> *)&E0.data_,
                 (SquareMatrix<std::complex<double>_> *)local_38);
      dense::kron<std::complex<double>>
                ((dense *)&local_170,(SquareMatrix<std::complex<double>_> *)local_e8,
                 (SquareMatrix<std::complex<double>_> *)local_98);
      dense::operator+((dense *)this,&local_160,&local_170);
      dense::SquareMatrix<std::complex<double>_>::~SquareMatrix(&local_170);
      dense::SquareMatrix<std::complex<double>_>::~SquareMatrix(&local_160);
    }
  }
  local_10c = 1;
  dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_e8);
  dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_98);
  dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_38);
  dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&E0.data_);
  SVar4.data_._M_t.
  super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
  super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
       extraout_RDX_01._M_t.
       super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
       _M_t.
       super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
       super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
  SVar4.size_ = (size_type_conflict)this;
  return SVar4;
}

Assistant:

qclab::dense::SquareMatrix< T > matrix() const override {
          using matrix_type = qclab::dense::SquareMatrix< T > ;
          const matrix_type  I2 = qclab::dense::eye< T >( 2 ) ;
          const matrix_type  E0( 1 , 0 ,
                                 0 , 0 ) ;
          const matrix_type  E1( 0 , 0 ,
                                 0 , 1 ) ;
          const matrix_type  CG = this->gate()->matrix() ;
          if ( controlState_ == 0 ) {
            if ( control() < target() ) {
              return qclab::dense::kron( E0 , CG ) +
                     qclab::dense::kron( E1 , I2 ) ;
            } else {
              return qclab::dense::kron( CG , E0 ) +
                     qclab::dense::kron( I2 , E1 ) ;
            }
          } else {
            if ( control() < target() ) {
              return qclab::dense::kron( E0 , I2 ) +
                     qclab::dense::kron( E1 , CG ) ;
            } else {
              return qclab::dense::kron( I2 , E0 ) +
                     qclab::dense::kron( CG , E1 ) ;
            }
          }
        }